

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLkParser.cpp
# Opt level: O3

void __thiscall antlr::LLkParser::trace(LLkParser *this,char *ee,char *rname)

{
  int iVar1;
  long *plVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  uint uVar7;
  string temp;
  long *local_80 [2];
  long local_70 [2];
  char *local_60;
  char *local_58;
  char local_50;
  undefined7 uStack_4f;
  LLkParser *local_40;
  TokenRefCount<antlr::Token> local_38;
  
  (*(this->super_Parser)._vptr_Parser[0x1b])();
  if (ee == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3063f0);
  }
  else {
    sVar3 = strlen(ee);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,ee,sVar3);
  }
  if (rname == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3063f0);
  }
  else {
    sVar3 = strlen(rname);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,rname,sVar3);
  }
  iVar1 = ((this->super_Parser).inputState.ref)->ptr->guessing;
  pcVar6 = "; ";
  if (0 < iVar1) {
    pcVar6 = "; [guessing]";
  }
  lVar5 = 2;
  if (0 < iVar1) {
    lVar5 = 0xc;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
  if (0 < *(int *)&(this->super_Parser).field_0x1c) {
    uVar7 = 0;
    local_40 = this;
    do {
      if (uVar7 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      }
      uVar7 = uVar7 + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"LA(",3);
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,uVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")==",3);
      local_58 = (char *)0x0;
      local_50 = '\0';
      local_60 = &local_50;
      (*(this->super_Parser)._vptr_Parser[3])(&local_38,this,(ulong)uVar7);
      (*(local_38.ref)->ptr->_vptr_Token[4])(local_80);
      pcVar6 = local_58;
      plVar2 = local_80[0];
      strlen((char *)local_80[0]);
      std::__cxx11::string::_M_replace((ulong)&local_60,0,pcVar6,(ulong)plVar2);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      TokenRefCount<antlr::Token>::~TokenRefCount(&local_38);
      this = local_40;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_60,(long)local_58);
      if (local_60 != &local_50) {
        operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
      }
    } while ((int)uVar7 < *(int *)&(this->super_Parser).field_0x1c);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  return;
}

Assistant:

void LLkParser::trace(const char* ee, const char* rname)
{
	traceIndent();

	cout << ee << rname << ((inputState->guessing>0)?"; [guessing]":"; ");

	for (int i = 1; i <= k; i++)
	{
		if (i != 1) {
			cout << ", ";
		}
		cout << "LA(" << i << ")==";

		string temp;

		try {
			temp = LT(i)->getText().c_str();
		}
		catch( ANTLRException& ae )
		{
			temp = "[error: ";
			temp += ae.toString();
			temp += ']';
		}
		cout << temp;
	}

	cout << endl;
}